

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O3

void __thiscall
boost::runtime::option::cla_name_help
          (option *this,ostream *ostr,cstring *cla_tag,cstring *negation_prefix_)

{
  ostream *poVar1;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  if (negation_prefix_->m_end == negation_prefix_->m_begin) {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,cla_tag->m_begin,cla_tag->m_end);
    std::__ostream_insert<char,std::char_traits<char>>(ostr,(char *)local_40,local_38);
    if (local_40 == local_30) {
      return;
    }
  }
  else {
    local_40 = (long *)CONCAT71(local_40._1_7_,0x5b);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(ostr,(char *)&local_40,1);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,negation_prefix_->m_begin,negation_prefix_->m_end);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    local_40 = (long *)CONCAT71(local_40._1_7_,0x5d);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_40,1);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,cla_tag->m_begin,cla_tag->m_end);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
    if (local_40 == local_30) {
      return;
    }
  }
  operator_delete(local_40,local_30[0] + 1);
  return;
}

Assistant:

virtual void    cla_name_help( std::ostream& ostr, cstring cla_tag, cstring negation_prefix_ ) const
    {
        if( negation_prefix_.is_empty() )
            ostr << cla_tag;
        else
            ostr << '[' << negation_prefix_ << ']' << cla_tag;
    }